

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O1

void __thiscall
QRhiImplementation::addCleanupCallback(QRhiImplementation *this,void *key,CleanupCallback *callback)

{
  long in_FS_OFFSET;
  void *local_38;
  TryEmplaceResult local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = key;
  QHash<void_const*,std::function<void(QRhi*)>>::tryEmplace_impl<void_const*const&>
            (&local_30,(QHash<void_const*,std::function<void(QRhi*)>> *)&this->keyedCleanupCallbacks
             ,&local_38);
  std::function<void_(QRhi_*)>::operator=
            ((function<void_(QRhi_*)> *)
             ((local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].entries
              [(local_30.iterator.i.d)->spans[local_30.iterator.i.bucket >> 7].offsets
               [(uint)local_30.iterator.i.bucket & 0x7f]].storage.data + 8),callback);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void addCleanupCallback(const void *key, const QRhi::CleanupCallback &callback)
    {
        keyedCleanupCallbacks[key] = callback;
    }